

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomwalk.cpp
# Opt level: O1

void __thiscall RandomWalk::calcola(RandomWalk *this)

{
  ulong uVar1;
  pointer ptVar2;
  pointer *__ptr;
  uint uVar3;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  size_t sizeth;
  long *local_68;
  thread local_60;
  vector<std::thread,_std::allocator<std::thread>_> local_58;
  ulong local_38;
  
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = this->n / this->nthreads;
  uVar3 = 1;
  do {
    local_60._M_id._M_thread = (id)0;
    local_68 = (long *)operator_new(0x20);
    *local_68 = (long)&PTR___State_00106d98;
    *(uint *)(local_68 + 1) = uVar3 - 1;
    local_68[2] = (long)&local_38;
    local_68[3] = (long)this;
    std::thread::_M_start_thread(&local_60,&local_68,0);
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&local_58,&local_60);
    if (local_60._M_id._M_thread != 0) goto LAB_00102771;
    uVar1 = (ulong)uVar3;
    uVar3 = uVar3 + 1;
  } while (uVar1 < this->nthreads);
  if (this->nthreads != 0) {
    uVar3 = 1;
    do {
      std::thread::join();
      uVar1 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar1 < this->nthreads);
  }
  ptVar2 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      if ((ptVar2->_M_id)._M_thread != 0) {
LAB_00102771:
        std::terminate();
      }
      ptVar2 = ptVar2 + 1;
    } while (ptVar2 != local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_58);
  return;
}

Assistant:

void RandomWalk::calcola()  noexcept{

    std::vector<std::thread> threads;
    size_t sizeth=n/nthreads;
    for (unsigned int ith=0;ith<nthreads;++ith){
        threads.push_back(std::thread([&,ith](){
            size_t start = sizeth*ith;
            size_t stop = sizeth*(ith+1);
            if (ith==nthreads-1) stop=n;
            for (size_t istep=start;istep<stop;++istep){
                randomWalk(&data[nsteps*istep],sigma,nsteps,dt,rnd[ith]);
            }
        }));
    }
    for (unsigned int ith=0;ith<nthreads;ith++)
        threads[ith].join();

    threads.clear();

}